

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

bool __thiscall Refal2::CRuleParser::BeginRule(CRuleParser *this)

{
  bool bVar1;
  allocator local_39;
  string local_38 [32];
  CRuleParser *local_18;
  CRuleParser *this_local;
  
  local_18 = this;
  bVar1 = CToken::IsNone(&this->functionName);
  if (bVar1) {
    CParsingElementState::Reset(&(this->super_CQualifierParser).super_CParsingElementState);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"try to define rule out of function",&local_39);
    error(this,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    beginRule(this);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool CRuleParser::BeginRule()
{
	if( !functionName.IsNone() ) {
		beginRule();
		return true;
	}
	CParsingElementState::Reset();
	error( "try to define rule out of function" );
	return false;
}